

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::GaugeTest_inc_negative_value_Test::TestBody
          (GaugeTest_inc_negative_value_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_58 [3];
  Message local_40;
  double local_38;
  double local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Gauge gauge;
  GaugeTest_inc_negative_value_Test *this_local;
  
  Gauge::Gauge((Gauge *)&gtest_ar.message_);
  Gauge::Increment((Gauge *)&gtest_ar.message_,-1.0);
  local_30 = Gauge::Value((Gauge *)&gtest_ar.message_);
  local_38 = -1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_28,"gauge.Value()","-1.0",&local_30,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/gauge_test.cc"
               ,0x24,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(GaugeTest, inc_negative_value) {
  Gauge gauge;
  gauge.Increment(-1.0);
  EXPECT_EQ(gauge.Value(), -1.0);
}